

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

buffer_appender<char> __thiscall
fmt::v7::detail::write_bytes<char,fmt::v7::detail::buffer_appender<char>>
          (detail *this,buffer_appender<char> out,string_view bytes,basic_format_specs<char> *specs)

{
  byte bVar1;
  buffer_appender<char> bVar2;
  uint *puVar3;
  char *pcVar4;
  ulong uVar5;
  buffer<char> *buf;
  ulong n;
  
  puVar3 = (uint *)bytes.size_;
  pcVar4 = bytes.data_;
  uVar5 = 0;
  if (pcVar4 <= (char *)(ulong)*puVar3) {
    uVar5 = (long)(ulong)*puVar3 - (long)pcVar4;
  }
  bVar1 = *(byte *)((long)&basic_data<void>::left_padding_shifts +
                   (ulong)(*(byte *)((long)puVar3 + 9) & 0xf));
  if (*(char **)(this + 0x18) <
      pcVar4 + *(byte *)((long)puVar3 + 0xe) * uVar5 + *(long *)(this + 0x10)) {
    (*(code *)**(undefined8 **)this)(this);
  }
  n = uVar5 >> (bVar1 & 0x3f);
  bVar2 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)this,n,(fill_t<char> *)((long)puVar3 + 10));
  bVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                    ((char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container,
                     pcVar4 + (long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container,bVar2);
  bVar2 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    (bVar2,uVar5 - n,(fill_t<char> *)((long)puVar3 + 10));
  return (buffer_appender<char>)
         bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write_bytes(OutputIt out, string_view bytes,
                     const basic_format_specs<Char>& specs) {
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, bytes.size(), [bytes](iterator it) {
    const char* data = bytes.data();
    return copy_str<Char>(data, data + bytes.size(), it);
  });
}